

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

String * efsw::String::fromUtf8(String *__return_storage_ptr__,string *utf8String)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  StringType utf32;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = L'\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  reserve(&local_38,utf8String->_M_string_length + 1);
  begin._M_current = (utf8String->_M_dataplus)._M_p;
  Utf<8u>::
  ToUtf32<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::u32string>>
            (begin,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(begin._M_current + utf8String->_M_string_length),&local_38);
  String(__return_storage_ptr__,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

String String::fromUtf8( const std::string& utf8String ) {
	String::StringType utf32;

	utf32.reserve( utf8String.length() + 1 );

	Utf8::ToUtf32( utf8String.begin(), utf8String.end(), std::back_inserter( utf32 ) );

	return String( utf32 );
}